

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O3

EulerAngles * __thiscall
KDIS::DATA_TYPE::EulerAngles::operator*
          (EulerAngles *__return_storage_ptr__,EulerAngles *this,KFLOAT64 Value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  KFLOAT32 KVar3;
  EulerAngles *tmp;
  
  (__return_storage_ptr__->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__EulerAngles_00224b58;
  KVar3 = this->m_f32Theta;
  __return_storage_ptr__->m_f32Psi = this->m_f32Psi;
  __return_storage_ptr__->m_f32Theta = KVar3;
  __return_storage_ptr__->m_f32Phi = this->m_f32Phi;
  uVar1 = __return_storage_ptr__->m_f32Psi;
  uVar2 = __return_storage_ptr__->m_f32Theta;
  __return_storage_ptr__->m_f32Psi = (KFLOAT32)(float)((double)Value * (double)(float)uVar1);
  __return_storage_ptr__->m_f32Theta = (KFLOAT32)(float)((double)Value * (double)(float)uVar2);
  __return_storage_ptr__->m_f32Phi =
       (KFLOAT32)(float)((double)(float)__return_storage_ptr__->m_f32Phi * (double)Value);
  return __return_storage_ptr__;
}

Assistant:

EulerAngles KDIS::DATA_TYPE::EulerAngles::operator * ( KFLOAT64 Value ) const
{
    EulerAngles tmp = *this;
    tmp.m_f32Psi   *= Value;
    tmp.m_f32Theta *= Value;
    tmp.m_f32Phi   *= Value;
    return tmp;
}